

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O1

void __thiscall glslang::TIntermediate::setSourceFile(TIntermediate *this,char *file)

{
  char *pcVar1;
  
  if (file != (char *)0x0) {
    pcVar1 = (char *)(this->sourceFile)._M_string_length;
    strlen(file);
    std::__cxx11::string::_M_replace((ulong)&this->sourceFile,0,pcVar1,(ulong)file);
    return;
  }
  return;
}

Assistant:

void setSourceFile(const char* file) { if (file != nullptr) sourceFile = file; }